

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O0

int Gia_ManAppendBuf(Gia_Man_t *p,int iLit)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pObj_00;
  ulong uVar4;
  Gia_Obj_t *pObj;
  int iLit_local;
  Gia_Man_t *p_local;
  
  pObj_00 = Gia_ManAppendObj(p);
  if (-1 < iLit) {
    iVar1 = Abc_Lit2Var(iLit);
    iVar2 = Gia_ManObjNum(p);
    if (iVar1 < iVar2) {
      iVar1 = Gia_ObjId(p,pObj_00);
      iVar2 = Abc_Lit2Var(iLit);
      uVar4 = (ulong)(uint)(iVar1 - iVar2) & 0x1fffffff;
      *(ulong *)pObj_00 = *(ulong *)pObj_00 & 0xe0000000ffffffff | uVar4 << 0x20;
      *(ulong *)pObj_00 = *(ulong *)pObj_00 & 0xffffffffe0000000 | uVar4;
      uVar3 = Abc_LitIsCompl(iLit);
      *(ulong *)pObj_00 = *(ulong *)pObj_00 & 0xdfffffffffffffff | ((ulong)uVar3 & 1) << 0x3d;
      *(ulong *)pObj_00 = *(ulong *)pObj_00 & 0xffffffffdfffffff | ((ulong)uVar3 & 1) << 0x1d;
      p->nBufs = p->nBufs + 1;
      iVar1 = Gia_ObjId(p,pObj_00);
      return iVar1 << 1;
    }
  }
  __assert_fail("iLit >= 0 && Abc_Lit2Var(iLit) < Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x2cd,"int Gia_ManAppendBuf(Gia_Man_t *, int)");
}

Assistant:

static inline int Gia_ManAppendBuf( Gia_Man_t * p, int iLit )  
{ 
    Gia_Obj_t * pObj = Gia_ManAppendObj( p );
    assert( iLit >= 0 && Abc_Lit2Var(iLit) < Gia_ManObjNum(p) );
    pObj->iDiff0  = pObj->iDiff1  = Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit);
    pObj->fCompl0 = pObj->fCompl1 = Abc_LitIsCompl(iLit);
    p->nBufs++;
    return Gia_ObjId( p, pObj ) << 1;
}